

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compile.cc
# Opt level: O0

uint64 re2::MakeRuneCacheKey(uint8 lo,uint8 hi,bool foldcase,int next)

{
  int next_local;
  bool foldcase_local;
  uint8 hi_local;
  uint8 lo_local;
  
  return (long)next << 0x11 | (ulong)lo << 9 | (ulong)hi << 1 | (ulong)foldcase;
}

Assistant:

static uint64 MakeRuneCacheKey(uint8 lo, uint8 hi, bool foldcase, int next) {
  return (uint64)next << 17 |
         (uint64)lo   <<  9 |
         (uint64)hi   <<  1 |
         (uint64)foldcase;
}